

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<$9099ad00$>::SmallVector
          (SmallVector<_9099ad00_> *this,SmallVector<_9099ad00_> *RHS)

{
  U *pUVar1;
  
  pUVar1 = &(this->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
            super_SmallVectorTemplateCommon<_82bc3fea_>.FirstEl;
  (this->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
  super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX = pUVar1;
  (this->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
  super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX = pUVar1;
  (this->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
  super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.CapacityX = this + 1;
  if ((RHS->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
      super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX !=
      (RHS->super_SmallVectorImpl<_1ba91462_>).super_SmallVectorTemplateBase<_d3e3f58d_>.
      super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX) {
    SmallVectorImpl<$1ba91462$>::operator=
              (&this->super_SmallVectorImpl<_1ba91462_>,&RHS->super_SmallVectorImpl<_1ba91462_>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }